

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

char * str_find_nocase(char *haystack,char *needle)

{
  char cVar1;
  __int32_t **pp_Var2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  
  do {
    pcVar4 = haystack;
    cVar3 = *pcVar4;
    lVar5 = 1;
    if (cVar3 == '\0') {
      return (char *)0x0;
    }
    while( true ) {
      cVar1 = needle[lVar5 + -1];
      if (cVar3 == '\0') break;
      if (cVar1 == '\0') {
        return pcVar4;
      }
      pp_Var2 = __ctype_tolower_loc();
      if ((*pp_Var2)[cVar3] != (*pp_Var2)[cVar1]) break;
      cVar3 = pcVar4[lVar5];
      lVar5 = lVar5 + 1;
    }
    haystack = pcVar4 + 1;
    if (cVar1 == '\0') {
      return pcVar4;
    }
  } while( true );
}

Assistant:

const char *str_find_nocase(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && tolower(*a) == tolower(*b))
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}